

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O0

void __thiscall
Sinclair::ZX8081::ConcreteMachine<false>::ConcreteMachine
          (ConcreteMachine<false> *this,Target *target,ROMFetcher *rom_fetcher)

{
  int iVar1;
  bool bVar2;
  Machine MVar3;
  undefined4 *puVar4;
  pointer ppVar5;
  size_type sVar6;
  ulong uVar7;
  byte local_159;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_d0;
  undefined1 local_c8 [8];
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  Name rom_name;
  bool use_zx81_rom;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_58;
  ROMFetcher *local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<false> *this_local;
  
  local_20 = rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_58);
  Configurable::Device::Device(&this->super_Device);
  rom_name = keyboard_machine();
  Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::
  TypeRecipient<Sinclair::ZX::Keyboard::Machine>
            (&this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>,&rom_name);
  ZX8081::Machine::Machine(&this->super_Machine);
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca6a80;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca6b50;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca6b88;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca6ba0;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca6bb8;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca6be8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca6c28;
  (this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).super_Delegate.
  super_KeyActions._vptr_KeyActions = (_func_int **)&PTR_set_key_state_00ca6c48;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca6c88;
  CPU::Z80::Processor<Sinclair::ZX8081::ConcreteMachine<false>,_false,_false>::Processor
            (&this->z80_,this);
  ZX8081::Video::Video(&this->video_);
  this->should_autorun_ = false;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->ram_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->rom_);
  this->vsync_ = false;
  this->hsync_ = false;
  this->line_counter_ = 0;
  MVar3 = keyboard_machine();
  ZX::Keyboard::Keyboard::Keyboard(&this->keyboard_,MVar3);
  MVar3 = keyboard_machine();
  ZX::Keyboard::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_,MVar3);
  HalfClockReceiver<Storage::Tape::BinaryTapePlayer>::BinaryTapePlayer(&this->tape_player_,0x319750)
  ;
  Storage::Tape::ZX8081::Parser::Parser(&this->parser_);
  this->nmi_is_enabled_ = false;
  HalfCycles::HalfCycles(&this->horizontal_counter_);
  this->latched_video_byte_ = '\0';
  this->has_latched_video_byte_ = false;
  this->use_fast_tape_hack_ = false;
  this->allow_fast_tape_hack_ = false;
  this->use_automatic_tape_motor_control_ = true;
  HalfCycles::HalfCycles(&this->tape_advance_delay_,0);
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  GI::AY38910::AY38910<false>::AY38910SampleSource(&this->ay_,AY38910,&this->audio_queue_);
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
            (&this->speaker_,&this->ay_);
  HalfCycles::HalfCycles(&this->time_since_ay_update_);
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,3250000.0);
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                   ,1.625e+06);
  local_159 = 1;
  if ((rom_fetcher_local[4].super__Function_base._M_functor._M_pod_data[0xc] & 1U) == 0) {
    local_159 = rom_fetcher_local[4].super__Function_base._M_functor._M_pod_data[0xd];
  }
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_159 & 1;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       request.node.children.
       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ | ZX80;
  ROM::Request::Request
            ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Name)request.node.children.
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,false);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_c8,local_20,
               (Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar2 = ROM::Request::validate
                    ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Map *)local_c8);
  if (bVar2) {
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)local_c8,
                (key_type *)
                &request.node.children.
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_d0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->rom_,&ppVar5->second);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->rom_);
    this->rom_mask_ = (short)sVar6 - 1;
    iVar1 = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 8);
    if (iVar1 == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->ram_,0x400);
      this->ram_base_ = 0x4000;
      this->ram_mask_ = 0x3ff;
    }
    else if (iVar1 == 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->ram_,0x4000);
      this->ram_base_ = 0x4000;
      this->ram_mask_ = 0x3fff;
    }
    else if (iVar1 == 2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->ram_,0x10000);
      this->ram_base_ = 0x2000;
      this->ram_mask_ = 0xffff;
    }
    Memory::Fuzz<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&this->ram_);
    clear_all_keys(this);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      type_string(this,(string *)&rom_fetcher_local[4].super__Function_base._M_manager);
      this->should_autorun_ = true;
    }
    insert_media(this,(Media *)&rom_fetcher_local->_M_invoker);
    std::
    map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)local_c8);
    ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Analyser::Static::ZX8081::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			Utility::TypeRecipient<CharacterMapper>(keyboard_machine()),
			z80_(*this),
			keyboard_(keyboard_machine()),
			keyboard_mapper_(keyboard_machine()),
			tape_player_(ZX8081ClockRate),
			ay_(GI::AY38910::Personality::AY38910, audio_queue_),
			speaker_(ay_) {
			set_clock_rate(ZX8081ClockRate);
			speaker_.set_input_rate(float(ZX8081ClockRate) / 2.0f);

			const bool use_zx81_rom = target.is_ZX81 || target.ZX80_uses_ZX81_ROM;
			const ROM::Name rom_name = use_zx81_rom ? ROM::Name::ZX81 : ROM::Name::ZX80;
			const ROM::Request request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}
			rom_ = std::move(roms.find(rom_name)->second);

			rom_mask_ = uint16_t(rom_.size() - 1);

			switch(target.memory_model) {
				case Analyser::Static::ZX8081::Target::MemoryModel::Unexpanded:
					ram_.resize(1024);
					ram_base_ = 16384;
					ram_mask_ = 1023;
				break;
				case Analyser::Static::ZX8081::Target::MemoryModel::SixteenKB:
					ram_.resize(16384);
					ram_base_ = 16384;
					ram_mask_ = 16383;
				break;
				case Analyser::Static::ZX8081::Target::MemoryModel::SixtyFourKB:
					ram_.resize(65536);
					ram_base_ = 8192;
					ram_mask_ = 65535;
				break;
			}
			Memory::Fuzz(ram_);

			// Ensure valid initial key state.
			clear_all_keys();
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
				should_autorun_ = true;
			}

			insert_media(target.media);
		}